

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void __thiscall
crnlib::symbol_codec::encode(symbol_codec *this,uint sym,adaptive_huffman_data_model *model)

{
  uint *puVar1;
  unsigned_short *puVar2;
  int iVar3;
  
  record_put_bits(this,(uint)(model->m_codes).m_p[sym],(uint)(model->m_code_sizes).m_p[sym]);
  puVar2 = (model->m_sym_freq).m_p;
  iVar3 = puVar2[sym] + 1;
  puVar2[sym] = (unsigned_short)iVar3;
  if (iVar3 == 0xffff) {
    adaptive_huffman_data_model::rescale(model);
  }
  puVar1 = &model->m_symbols_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return;
  }
  this->m_total_model_updates = this->m_total_model_updates + 1;
  adaptive_huffman_data_model::update(model);
  return;
}

Assistant:

void symbol_codec::encode(uint sym, adaptive_huffman_data_model& model)
    {
        CRNLIB_ASSERT(m_mode == cEncoding);
        CRNLIB_ASSERT(model.m_encoding);

        record_put_bits(model.m_codes[sym], model.m_code_sizes[sym]);

        uint freq = model.m_sym_freq[sym];
        freq++;
        model.m_sym_freq[sym] = static_cast<uint16>(freq);

        if (freq == cUINT16_MAX)
        {
            model.rescale();
        }

        if (--model.m_symbols_until_update == 0)
        {
            m_total_model_updates++;
            model.update();
        }
    }